

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall Am_Object_Advanced::Invoke_Demons(Am_Object_Advanced *this,bool active)

{
  Am_Object_Data *pAVar1;
  bool active_local;
  Am_Object_Advanced *this_local;
  
  if ((this->super_Am_Object).data == (Am_Object_Data *)0x0) {
    Am_Error("** Invoke_Demons called on a (0L) object.");
  }
  if (active) {
    pAVar1 = (this->super_Am_Object).data;
    pAVar1->demons_active = pAVar1->demons_active | 0x8000;
  }
  else {
    pAVar1 = (this->super_Am_Object).data;
    pAVar1->demons_active = pAVar1->demons_active & 0x7fff;
  }
  return;
}

Assistant:

void
Am_Object_Advanced::Invoke_Demons(bool active)
{
  if (!data)
    Am_Error("** Invoke_Demons called on a (0L) object.");
  if (active)
    data->demons_active |= DEMONS_ACTIVE;
  else
    data->demons_active &= ~DEMONS_ACTIVE;
}